

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

double __thiscall
helics::RandomDelayFilterOperation::getProperty
          (RandomDelayFilterOperation *this,string_view property)

{
  bool bVar1;
  long lVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  
  __y._M_str = "param1";
  __y._M_len = 6;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  lVar2 = 8;
  if ((((!bVar1) &&
       (__y_00._M_str = "mean", __y_00._M_len = 4,
       bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_00),
       !bVar1)) &&
      (__y_01._M_str = "min", __y_01._M_len = 3,
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_01),
      !bVar1)) &&
     (__y_02._M_str = "alpha", __y_02._M_len = 5,
     bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_02),
     !bVar1)) {
    __y_03._M_str = "param2";
    __y_03._M_len = 6;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_03);
    lVar2 = 0x10;
    if (((!bVar1) &&
        (__y_04._M_str = "stddev", __y_04._M_len = 6,
        bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_04),
        !bVar1)) &&
       ((__y_05._M_str = "max", __y_05._M_len = 3,
        bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_05),
        !bVar1 && (__y_06._M_str = "beta", __y_06._M_len = 4,
                  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property
                                          ,__y_06), !bVar1)))) {
      return -1e+49;
    }
  }
  return *(double *)
          ((long)&(((this->rdelayGen)._M_t.
                    super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                    .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                  dist)._M_i + lVar2);
}

Assistant:

double RandomDelayFilterOperation::getProperty(std::string_view property)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        return (rdelayGen->param1.load());
    }
    if ((property == "param2") || (property == "stddev") || (property == "max") ||
        (property == "beta")) {
        return (rdelayGen->param2.load());
    }
    return FilterOperations::getProperty(property);
}